

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O1

int outformatlen_stream(out_stream_info *stream,char *s,size_t slen)

{
  ulong *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  uchar uVar4;
  uchar uVar5;
  ushort uVar6;
  ushort prop;
  char *pcVar7;
  bool bVar8;
  char cVar9;
  byte bVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  int extraout_EAX;
  int extraout_EAX_00;
  byte *pbVar14;
  ulong uVar15;
  byte *extraout_RAX;
  undefined7 extraout_var;
  ushort **ppuVar16;
  size_t sVar17;
  byte *extraout_RAX_00;
  byte *extraout_RAX_01;
  byte *extraout_RAX_02;
  out_stream_info *poVar18;
  byte *extraout_RAX_03;
  undefined7 extraout_var_00;
  undefined8 extraout_RAX_04;
  undefined8 extraout_RAX_05;
  byte *extraout_RAX_06;
  byte *extraout_RAX_07;
  byte *extraout_RAX_08;
  byte *extraout_RAX_09;
  byte *extraout_RAX_10;
  byte *extraout_RAX_11;
  byte *extraout_RAX_12;
  byte *extraout_RAX_13;
  byte *extraout_RAX_14;
  byte *extraout_RAX_15;
  byte *extraout_RAX_16;
  byte *extraout_RAX_17;
  byte *extraout_RAX_18;
  int iVar19;
  char *pcVar20;
  out_stream_info *in_R9;
  out_stream_info *poVar21;
  byte *pbVar22;
  ushort *puVar23;
  long lVar24;
  byte *pbVar25;
  byte *pbVar26;
  char **ppcVar27;
  bool bVar28;
  byte *local_228;
  byte *local_220;
  char **local_218;
  byte *local_210;
  uint local_204;
  int is_end_tag_1;
  undefined4 local_1fc;
  char fmsbuf [40];
  byte local_1d0 [4];
  int local_1cc;
  char *local_1c8;
  byte *local_1c0;
  char fmsbuf_srch [40];
  char attrname [128];
  
  if ((G_recurse == 0) || (iVar12 = G_recurse, G_cur_stream == stream)) {
    G_recurse = G_recurse + 1;
    pbVar22 = (byte *)(ulong)(uint)G_recurse;
    if (slen == 0) {
      poVar18 = (out_stream_info *)0x0;
      local_228 = (byte *)0x0;
      local_220 = (byte *)s;
    }
    else {
      local_228 = (byte *)(slen - 1);
      pbVar22 = (byte *)(s + 1);
      poVar18 = (out_stream_info *)(ulong)(byte)*s;
      local_220 = pbVar22;
    }
    G_cur_stream = stream;
    if ((char)poVar18 == '\0') {
      iVar12 = (int)CONCAT71((int7)((ulong)pbVar22 >> 8),1);
      pbVar22 = (byte *)0x0;
    }
    else {
      local_1c8 = stream->html_title_buf;
      ppcVar27 = &stream->html_title_ptr;
      pbVar14 = (byte *)-(long)fmsbuf;
      local_1c0 = pbVar14;
      local_1cc = 0;
      pbVar22 = (byte *)0x0;
      bVar28 = false;
      local_218 = ppcVar27;
      do {
        bVar10 = (byte)poVar18;
        if (bVar28) {
          uVar15 = CONCAT71((int7)((ulong)pbVar14 >> 8),bVar10 == 0x5c);
          if ((pbVar22 != local_1d0 && bVar10 != 0x5c) &&
             ((stream->html_mode == 0 ||
              ((bVar10 != 0x3c && (uVar15 = (ulong)poVar18 & 0xff, (int)uVar15 != 0x26)))))) {
            puVar23 = (ushort *)CONCAT71((int7)(uVar15 >> 8),bVar10 == 0x25);
            if (pbVar22 == (byte *)fmsbuf && bVar10 == 0x25) {
              outchar_noxlat_stream(stream,G_cmap_output[0x25]);
LAB_0012f6a7:
              bVar28 = false;
            }
            else {
              if (bVar10 == 0x25) {
                *pbVar22 = 0;
                lVar24 = (long)fmsbuf[0];
                bVar28 = true;
                local_210 = pbVar22;
                if (lVar24 < 0) {
LAB_0012f375:
                  local_1fc = (undefined4)CONCAT71((int7)((ulong)puVar23 >> 8),1);
                }
                else {
                  ppuVar16 = __ctype_b_loc();
                  puVar23 = *ppuVar16;
                  if ((*(byte *)((long)puVar23 + lVar24 * 2 + 1) & 1) == 0) goto LAB_0012f375;
                  if (0 < (long)fmsbuf[1]) {
                    bVar28 = (*(byte *)((long)puVar23 + (long)fmsbuf[1] * 2 + 1) & 1) == 0;
                  }
                  local_1fc = 0;
                }
                strcpy(fmsbuf_srch,fmsbuf);
                os_strlwr(fmsbuf_srch);
                sVar17 = strlen(fmsbuf_srch);
                puVar23 = (ushort *)fmsbase;
                do {
                  if (fmstop <= puVar23) break;
                  uVar6 = puVar23[1];
                  uVar11 = uVar6 - 2;
                  if (uVar11 == (uint)sVar17) {
                    prop = *puVar23;
                    iVar12 = bcmp(puVar23 + 2,fmsbuf_srch,(ulong)uVar11);
                    if (iVar12 != 0) goto LAB_0012f5a8;
                    uVar4 = stream->allcapsflag;
                    if (bVar28) {
                      if ((char)local_1fc == '\0') {
                        stream->capsflag = '\x01';
                        stream->nocapsflag = '\0';
                        stream->allcapsflag = '\0';
                      }
                    }
                    else {
                      stream->allcapsflag = '\x01';
                      stream->capsflag = '\0';
                      stream->nocapsflag = '\0';
                    }
                    bVar8 = false;
                    in_R9 = (out_stream_info *)(ulong)prop;
                    runpprop(runctx,(uchar **)0x0,0,0,cmdActor,prop,0,0,cmdActor);
                    stream->allcapsflag = uVar4;
                    stream->capsflag = '\0';
                    stream->nocapsflag = '\0';
                    ppcVar27 = local_218;
                  }
                  else {
LAB_0012f5a8:
                    puVar23 = (ushort *)((long)puVar23 + (ulong)uVar6 + 2);
                    bVar8 = true;
                  }
                } while (bVar8);
                pbVar22 = local_210;
                if (puVar23 == (ushort *)fmstop) {
                  outchar_noxlat_stream(stream,G_cmap_output[0x25]);
                  if (fmsbuf < pbVar22) {
                    pbVar14 = local_1c0 + (long)pbVar22;
                    pbVar26 = (byte *)0x0;
                    do {
                      outchar_noxlat_stream(stream,G_cmap_output[(byte)fmsbuf[(long)pbVar26]]);
                      pbVar26 = pbVar26 + 1;
                    } while (pbVar14 != pbVar26);
                  }
                  outchar_noxlat_stream(stream,G_cmap_output[0x25]);
                  ppcVar27 = local_218;
                }
                goto LAB_0012f6a7;
              }
              *pbVar22 = bVar10;
              pbVar22 = pbVar22 + 1;
              bVar28 = true;
            }
            goto LAB_0012f6af;
          }
          outchar_noxlat_stream(stream,G_cmap_output[0x25]);
          bVar28 = false;
          pbVar14 = (byte *)fmsbuf;
          if (fmsbuf < pbVar22) {
            pbVar26 = local_1c0 + (long)pbVar22;
            pbVar25 = (byte *)0x0;
            do {
              outchar_noxlat_stream(stream,G_cmap_output[(byte)fmsbuf[(long)pbVar25]]);
              pbVar25 = pbVar25 + 1;
              pbVar14 = extraout_RAX;
              ppcVar27 = local_218;
            } while (pbVar26 != pbVar25);
LAB_0012f284:
            bVar28 = false;
          }
        }
        else {
          uVar11 = stream->html_mode_flag;
          if (3 < (ulong)uVar11) goto LAB_0012f398;
          pbVar14 = (byte *)((long)&switchD_0012f2aa::switchdataD_0013dbd0 +
                            (long)(int)(&switchD_0012f2aa::switchdataD_0013dbd0)[uVar11]);
          switch(uVar11) {
          case 0:
            if ((bVar10 != 0x3c) && (stream->html_in_ignore != 0)) {
              if (bVar10 == 0x26) {
                cVar9 = out_parse_entity(fmsbuf_srch,(size_t)&local_220,(char **)&local_228,
                                         (size_t *)&switchD_0012f2aa::switchdataD_0013dbd0);
                poVar18 = (out_stream_info *)(CONCAT71(extraout_var,cVar9) & 0xffffffff);
                pbVar14 = (byte *)CONCAT71(extraout_var,cVar9);
              }
              else {
                fmsbuf_srch[0] = bVar10;
                fmsbuf_srch[1] = '\0';
                if (local_228 == (byte *)0x0) {
                  poVar18 = (out_stream_info *)0x0;
                  pbVar14 = (byte *)0x0;
                }
                else {
                  local_228 = local_228 + -1;
                  poVar18 = (out_stream_info *)(ulong)*local_220;
                  pbVar14 = local_220;
                  local_220 = local_220 + 1;
                }
              }
              pbVar14 = (byte *)CONCAT71((int7)((ulong)pbVar14 >> 8),fmsbuf_srch[0]);
              if (fmsbuf_srch[0] != '\0' && stream->html_in_title != 0) {
                pcVar20 = fmsbuf_srch;
                do {
                  pcVar20 = pcVar20 + 1;
                  pcVar7 = *ppcVar27;
                  puVar1 = (ulong *)(pcVar7 + 1);
                  if (puVar1 < ppcVar27) {
                    *ppcVar27 = (char *)puVar1;
                    *pcVar7 = (char)pbVar14;
                  }
                  pbVar14 = (byte *)CONCAT71((int7)((ulong)pbVar14 >> 8),*pcVar20);
                } while (*pcVar20 != '\0');
              }
              goto LAB_0012f284;
            }
            if (bVar10 == 0x25) {
              bVar28 = true;
              pbVar22 = (byte *)fmsbuf;
            }
            else {
              iVar12 = (int)((ulong)poVar18 & 0xff);
              if (iVar12 == 0x5c) {
                if (local_228 == (byte *)0x0) {
                  bVar10 = 0;
                  pbVar14 = local_228;
                }
                else {
                  local_228 = local_228 + -1;
                  bVar10 = *local_220;
                  pbVar14 = local_220;
                  local_220 = local_220 + 1;
                }
                if ((((stream->capturing == 0) || (bVar10 == 0)) || (bVar10 == 0x5e)) ||
                   (bVar10 == 0x76)) {
                  if (bVar10 < 0x48) {
                    if (bVar10 < 0x28) {
                      if (bVar10 == 0) {
                        local_1cc = 1;
                      }
                      else {
                        if (bVar10 != 0x20) goto LAB_0012f752;
                        uVar5 = G_cmap_output[0x1a];
                        if ((stream->html_target != 0) && (stream->html_mode != 0)) {
                          pcVar20 = "&nbsp;";
                          goto LAB_0012fef1;
                        }
LAB_0012f75d:
                        outchar_noxlat_stream(stream,uVar5);
                        pbVar14 = extraout_RAX_00;
                      }
                    }
                    else if (bVar10 == 0x28) {
                      if ((stream->html_mode == 0) || (stream->html_target == 0)) {
                        *(byte *)&stream->cur_attr = (byte)stream->cur_attr | 1;
                      }
                      else {
                        pcVar20 = "<B>";
LAB_0012fef1:
                        outstring_stream(stream,pcVar20);
                        pbVar14 = extraout_RAX_08;
                      }
                    }
                    else {
                      if (bVar10 != 0x29) {
                        if (bVar10 == 0x2d) {
                          if (local_228 == (byte *)0x0) {
                            uVar15 = 0;
                          }
                          else {
                            local_228 = local_228 + -1;
                            uVar15 = (ulong)*local_220;
                            local_220 = local_220 + 1;
                          }
                          goto LAB_0012fbbb;
                        }
LAB_0012f752:
                        uVar5 = G_cmap_output[bVar10];
                        goto LAB_0012f75d;
                      }
                      if ((stream->html_mode != 0) && (stream->html_target != 0)) {
                        pcVar20 = "</B>";
                        goto LAB_0012fef1;
                      }
                      *(byte *)&stream->cur_attr = (byte)stream->cur_attr & 0xfe;
                    }
                  }
                  else if (bVar10 < 0x6e) {
                    if (bVar10 == 0x48) {
                      if (local_228 == (byte *)0x0) {
                        bVar10 = 0;
                        pbVar14 = local_228;
                      }
                      else {
                        local_228 = local_228 + -1;
                        bVar10 = *local_220;
                        pbVar14 = local_220;
                        local_220 = local_220 + 1;
                      }
                      if (bVar10 == 0x2d) {
                        if (stream->html_target != 0) {
                          outflushn_stream(stream,0);
                          pbVar14 = extraout_RAX_10;
                        }
                        stream->html_mode = 0;
                      }
                      else {
                        if (stream->html_target != 0) {
                          outflushn_stream(stream,0);
                          pbVar14 = extraout_RAX_11;
                        }
                        stream->html_mode = 1;
                        if ((bVar10 != 0) && (pbVar14 = (byte *)(ulong)bVar10, bVar10 != 0x2b)) {
                          outchar_noxlat_stream(stream,pbVar14[0x14e420]);
                          pbVar14 = extraout_RAX_12;
                        }
                      }
                    }
                    else if (bVar10 == 0x5e) {
                      stream->capsflag = '\x01';
                      stream->nocapsflag = '\0';
                    }
                    else {
                      if (bVar10 != 0x62) goto LAB_0012f752;
                      outblank_stream(stream);
                      pbVar14 = extraout_RAX_02;
                    }
                  }
                  else if (bVar10 == 0x6e) {
                    outflushn_stream(stream,1);
                    pbVar14 = extraout_RAX_09;
                  }
                  else if (bVar10 == 0x74) {
                    outtab_stream(stream);
                    pbVar14 = extraout_RAX_07;
                  }
                  else {
                    if (bVar10 != 0x76) goto LAB_0012f752;
                    stream->capsflag = '\0';
                    stream->nocapsflag = '\x01';
                  }
                }
                else {
                  outchar_noxlat_stream(stream,G_cmap_output[0x5c]);
                  outchar_noxlat_stream(stream,G_cmap_output[bVar10]);
                  pbVar14 = extraout_RAX_01;
                  if (bVar10 == 0x2d) {
                    if (local_228 == (byte *)0x0) {
                      uVar15 = 0;
                    }
                    else {
                      local_228 = local_228 + -1;
                      uVar15 = (ulong)*local_220;
                      local_220 = local_220 + 1;
                    }
LAB_0012fbbb:
                    outchar_noxlat_stream(stream,G_cmap_output[uVar15]);
                    if (local_228 == (byte *)0x0) {
                      uVar15 = 0;
                    }
                    else {
                      local_228 = local_228 + -1;
                      uVar15 = (ulong)*local_220;
                      local_220 = local_220 + 1;
                    }
                    uVar5 = G_cmap_output[uVar15];
                    goto LAB_0012fbf4;
                  }
                }
LAB_0012fe6b:
                bVar28 = false;
              }
              else {
                if (stream->html_target == 0) {
                  if (stream->html_mode != 0) {
                    if (bVar10 == 0x26) {
                      cVar9 = out_parse_entity(fmsbuf_srch,(size_t)&local_220,(char **)&local_228,
                                               (size_t *)(ulong)(uint)stream->html_target);
                      poVar18 = (out_stream_info *)(CONCAT71(extraout_var_00,cVar9) & 0xffffffff);
                      pbVar14 = (byte *)CONCAT71(extraout_var_00,fmsbuf_srch[0]);
                      if (fmsbuf_srch[0] != '\0') {
                        pcVar20 = fmsbuf_srch;
                        do {
                          pcVar20 = pcVar20 + 1;
                          outchar_noxlat_stream(stream,(char)pbVar14);
                          pbVar14 = (byte *)CONCAT71((int7)((ulong)extraout_RAX_04 >> 8),*pcVar20);
                        } while (*pcVar20 != '\0');
                      }
                      goto LAB_0012f284;
                    }
                    if (iVar12 == 0x3c) {
                      bVar10 = read_tag(attrname,(size_t)&is_end_tag_1,(int *)&local_220,
                                        (char **)&local_228,(size_t *)0x0,in_R9);
                      poVar18 = (out_stream_info *)(ulong)bVar10;
                      uVar11 = stricmp(attrname,"br");
                      pbVar14 = (byte *)(ulong)uVar11;
                      if (uVar11 == 0) {
                        if (stream->html_in_ignore == 0) {
                          if (stream->linepos == '\0') {
                            stream->html_defer_br = 2;
                          }
                          else {
                            stream->html_defer_br = 1;
                          }
                        }
                      }
                      else {
                        iVar12 = stricmp(attrname,"b");
                        if ((((iVar12 == 0) || (iVar12 = stricmp(attrname,"i"), iVar12 == 0)) ||
                            (iVar12 = stricmp(attrname,"em"), iVar12 == 0)) ||
                           (iVar12 = stricmp(attrname,"strong"), iVar12 == 0)) {
                          pbVar14 = (byte *)0x0;
                          uVar11 = attrname._0_4_ & 0xff;
                          if ((attrname._0_4_ & 0xff) < 0x62) {
                            uVar13 = attrname._0_4_ & 0xff;
                            if (uVar13 < 0x49) {
                              if ((uVar11 == 0x42) || (uVar13 == 0x45)) {
LAB_0012fff6:
                                local_204 = 1;
                              }
                            }
                            else if (uVar13 == 0x49) {
LAB_001300ae:
                              local_204 = 2;
                            }
                            else if (uVar11 == 0x53) {
LAB_001300a4:
                              local_204 = 0;
                            }
                          }
                          else if ((attrname._0_4_ & 0xff) < 0x69) {
                            if ((uVar11 == 0x62) || (uVar11 == 0x65)) goto LAB_0012fff6;
                          }
                          else {
                            if (uVar11 == 0x69) goto LAB_001300ae;
                            if (uVar11 == 0x73) goto LAB_001300a4;
                          }
                          if (stream->html_in_ignore == 0) {
                            if (is_end_tag_1 == 0) {
                              pbVar14 = (byte *)(ulong)local_204;
                              stream->cur_attr = stream->cur_attr | local_204;
                            }
                            else {
                              pbVar14 = (byte *)(ulong)~local_204;
                              stream->cur_attr = stream->cur_attr & ~local_204;
                            }
                          }
                        }
                        else {
                          uVar11 = stricmp(attrname,"p");
                          pbVar14 = (byte *)(ulong)uVar11;
                          if (uVar11 == 0) {
                            if (stream->html_in_ignore == 0) {
                              outblank_stream(stream);
                              pbVar14 = extraout_RAX_13;
                            }
                          }
                          else {
                            uVar11 = stricmp(attrname,"tab");
                            pbVar14 = (byte *)(ulong)uVar11;
                            if (uVar11 == 0) {
                              if (stream->html_in_ignore == 0) {
                                outtab_stream(stream);
                                pbVar14 = extraout_RAX_14;
                              }
                            }
                            else {
                              uVar11 = stricmp(attrname,"img");
                              if ((uVar11 == 0) || (uVar11 = stricmp(attrname,"sound"), uVar11 == 0)
                                 ) {
                                pbVar14 = (byte *)(ulong)uVar11;
                                stream->html_allow_alt = 1;
                              }
                              else {
                                local_210 = pbVar22;
                                uVar11 = stricmp(attrname,"hr");
                                pbVar14 = (byte *)(ulong)uVar11;
                                if (uVar11 == 0) {
                                  pbVar22 = local_210;
                                  ppcVar27 = local_218;
                                  if (stream->html_in_ignore == 0) {
                                    outflushn_stream(stream,1);
                                    if (1 < G_os_linewidth) {
                                      uVar11 = G_os_linewidth - 1;
                                      do {
                                        sVar17 = 99;
                                        if (uVar11 < 99) {
                                          sVar17 = (size_t)uVar11;
                                        }
                                        memset(fmsbuf_srch,0x5f,sVar17);
                                        fmsbuf_srch[sVar17] = '\0';
                                        bVar10 = fmsbuf_srch[0];
                                        pbVar22 = (byte *)fmsbuf_srch;
                                        while (pbVar22 = pbVar22 + 1, bVar10 != 0) {
                                          outchar_noxlat_stream(stream,G_cmap_output[bVar10]);
                                          bVar10 = *pbVar22;
                                        }
                                        uVar13 = uVar11 - (int)sVar17;
                                        bVar28 = (int)sVar17 <= (int)uVar11;
                                        uVar11 = uVar13;
                                      } while (uVar13 != 0 && bVar28);
                                    }
                                    outblank_stream(stream);
                                    pbVar14 = extraout_RAX_15;
                                    pbVar22 = local_210;
                                    ppcVar27 = local_218;
                                  }
                                }
                                else {
                                  uVar11 = stricmp(attrname,"q");
                                  iVar12 = is_end_tag_1;
                                  pbVar14 = (byte *)(ulong)uVar11;
                                  if (uVar11 == 0) {
                                    pbVar22 = local_210;
                                    ppcVar27 = local_218;
                                    if (stream->html_in_ignore == 0) {
                                      if (is_end_tag_1 == 0) {
                                        uVar11 = stream->html_quote_level;
                                        stream->html_quote_level = uVar11 + 1;
                                        uVar11 = (uint)((uVar11 & 1) == 0) * 4 + 0x2018;
                                      }
                                      else {
                                        uVar11 = ((byte)stream->html_quote_level & 1) * 4 + 0x2019;
                                      }
                                      outchar_html_stream(stream,uVar11);
                                      pbVar14 = extraout_RAX_17;
                                      pbVar22 = local_210;
                                      ppcVar27 = local_218;
                                      if (iVar12 != 0) {
                                        stream->html_quote_level = stream->html_quote_level + -1;
                                      }
                                    }
                                  }
                                  else {
                                    iVar12 = stricmp(attrname,"title");
                                    if (iVar12 == 0) {
                                      pbVar22 = local_210;
                                      ppcVar27 = local_218;
                                      if (is_end_tag_1 == 0) {
                                        if (stream->html_in_title == 0) {
                                          stream->html_title_ptr = local_1c8;
                                        }
                                        stream->html_in_ignore = stream->html_in_ignore + 1;
                                        uVar11 = stream->html_in_title + 1;
                                        pbVar14 = (byte *)(ulong)uVar11;
                                        stream->html_in_title = uVar11;
                                      }
                                      else {
                                        uVar2 = stream->html_in_ignore;
                                        uVar3 = stream->html_in_title;
                                        uVar11 = uVar3 - 1;
                                        stream->html_in_ignore = uVar2 + -1;
                                        stream->html_in_title = uVar11;
                                        pbVar14 = (byte *)(ulong)uVar11;
                                        if (uVar11 == 0) {
                                          *stream->html_title_ptr = '\0';
                                          os_set_title(local_1c8);
                                          pbVar14 = extraout_RAX_16;
                                          pbVar22 = local_210;
                                          ppcVar27 = local_218;
                                        }
                                      }
                                    }
                                    else {
                                      iVar12 = stricmp(attrname,"aboutbox");
                                      if (iVar12 == 0) {
                                        if (is_end_tag_1 == 0) {
                                          uVar11 = stream->html_in_ignore + 1;
                                        }
                                        else {
                                          uVar11 = stream->html_in_ignore - 1;
                                        }
                                        pbVar14 = (byte *)(ulong)uVar11;
                                        stream->html_in_ignore = uVar11;
                                        pbVar22 = local_210;
                                        ppcVar27 = local_218;
                                      }
                                      else {
                                        uVar11 = stricmp(attrname,"pre");
                                        pbVar14 = (byte *)(ulong)uVar11;
                                        pbVar22 = local_210;
                                        ppcVar27 = local_218;
                                        if (uVar11 == 0) {
                                          if (is_end_tag_1 == 0) {
                                            stream->html_pre_level = stream->html_pre_level + 1;
                                            outblank_stream(stream);
                                            pbVar14 = extraout_RAX_18;
                                            pbVar22 = local_210;
                                            ppcVar27 = local_218;
                                          }
                                          else {
                                            outblank_stream(stream);
                                            uVar11 = stream->html_pre_level;
                                            pbVar14 = (byte *)(ulong)uVar11;
                                            pbVar22 = local_210;
                                            ppcVar27 = local_218;
                                            if (uVar11 != 0) {
                                              pbVar14 = (byte *)(ulong)(uVar11 - 1);
                                              stream->html_pre_level = uVar11 - 1;
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                      stream->html_mode_flag = 1;
                      goto LAB_0012f284;
                    }
                  }
                }
                else if ((bVar10 == 0x3c) && (stream->html_mode != 0)) {
                  bVar10 = read_tag(fmsbuf_srch,(size_t)attrname,(int *)&local_220,
                                    (char **)&local_228,(size_t *)stream,in_R9);
                  uVar11 = stricmp(fmsbuf_srch,"pre");
                  pbVar14 = (byte *)(ulong)uVar11;
                  if (uVar11 == 0) {
                    if (attrname._0_4_ == 0) {
                      stream->html_pre_level = stream->html_pre_level + 1;
                    }
                    else {
                      uVar11 = stream->html_pre_level;
                      pbVar14 = (byte *)(ulong)uVar11;
                      if (uVar11 != 0) {
                        pbVar14 = (byte *)(ulong)(uVar11 - 1);
                        stream->html_pre_level = uVar11 - 1;
                      }
                    }
                  }
                  if (bVar10 != 0) goto LAB_0012f752;
                  goto LAB_0012fe6b;
                }
                uVar5 = G_cmap_output[(ulong)poVar18 & 0xff];
LAB_0012fbf4:
                outchar_noxlat_stream(stream,uVar5);
                bVar28 = false;
                pbVar14 = extraout_RAX_03;
              }
            }
            if (local_1cc == 0) goto LAB_0012f6af;
            goto LAB_0012fe7b;
          case 1:
            if (bVar10 == 0x22) {
              stream->html_mode_flag = 3;
            }
            else {
              iVar12 = (int)((ulong)poVar18 & 0xff);
              if (iVar12 == 0x27) {
                stream->html_mode_flag = 2;
              }
              else if (iVar12 == 0x3e) {
                stream->html_mode_flag = 0;
                if (stream->html_defer_br == 2) {
                  outblank_stream(stream);
                }
                else if (stream->html_defer_br == 1) {
                  outflushn_stream(stream,1);
                }
                stream->html_defer_br = 0;
                stream->html_allow_alt = 0;
              }
              else if ((-1 < (char)bVar10) &&
                      (ppuVar16 = __ctype_b_loc(),
                      (*(byte *)((long)*ppuVar16 + ((ulong)poVar18 & 0xff) * 2 + 1) & 4) != 0)) {
                lVar24 = 0x7f;
                pcVar20 = attrname;
                poVar21 = in_R9;
                do {
                  uVar11 = (uint)poVar18;
                  bVar28 = lVar24 == 0;
                  lVar24 = lVar24 + -1;
                  in_R9 = poVar21;
                  if (bVar28) break;
                  *pcVar20 = (char)poVar18;
                  if (local_228 == (byte *)0x0) {
                    in_R9 = (out_stream_info *)0x0;
                  }
                  else {
                    local_228 = local_228 + -1;
                    in_R9 = (out_stream_info *)(ulong)*local_220;
                    local_220 = local_220 + 1;
                  }
                  uVar11 = (uint)in_R9;
                  if ((char)in_R9 < '\0') {
                    pcVar20 = pcVar20 + 1;
                    in_R9 = poVar21;
                    break;
                  }
                  pcVar20 = pcVar20 + 1;
                  poVar21 = in_R9;
                  poVar18 = in_R9;
                } while ((*(byte *)((long)*ppuVar16 + (long)in_R9 * 2 + 1) & 0xc) != 0);
                *pcVar20 = '\0';
                if ((char)uVar11 == '=') {
                  if (local_228 == (byte *)0x0) {
                    uVar15 = 0;
                  }
                  else {
                    local_228 = local_228 + -1;
                    uVar15 = (ulong)*local_220;
                    local_220 = local_220 + 1;
                  }
                  iVar12 = (int)uVar15;
                  if (((char)uVar15 == '\'') || (iVar19 = 0, iVar12 == 0x22)) {
                    iVar19 = iVar12;
                    if (local_228 == (byte *)0x0) {
                      uVar15 = 0;
                    }
                    else {
                      local_228 = local_228 + -1;
                      uVar15 = (ulong)*local_220;
                      local_220 = local_220 + 1;
                    }
                  }
                  in_R9 = (out_stream_info *)0x0;
                  lVar24 = 0;
                  do {
                    fmsbuf_srch[(long)in_R9] = (char)uVar15;
                    if (local_228 == (byte *)0x0) {
                      uVar15 = 0;
                    }
                    else {
                      local_228 = local_228 + -1;
                      uVar15 = (ulong)*local_220;
                      local_220 = local_220 + 1;
                    }
                    uVar11 = (uint)uVar15;
                    cVar9 = (char)uVar15;
                    if (cVar9 == '\0') {
                      pcVar20 = fmsbuf_srch + (1 - lVar24);
                      if (iVar19 == 0x27) {
                        stream->html_mode_flag = 2;
                      }
                      else if (iVar19 == 0x22) {
                        stream->html_mode_flag = 3;
                      }
                      else {
                        stream->html_mode_flag = 1;
                      }
                      goto LAB_0012fd1c;
                    }
                    if (iVar19 == 0) {
                      if ((cVar9 < '\0') ||
                         ((*(byte *)((long)*ppuVar16 + uVar15 * 2 + 1) & 0xc) == 0))
                      goto LAB_0012fd07;
                    }
                    else if (iVar19 == cVar9) {
LAB_0012fd07:
                      pcVar20 = fmsbuf_srch + 1;
                      goto LAB_0012fd19;
                    }
                    lVar24 = lVar24 + -1;
                    in_R9 = (out_stream_info *)((long)&in_R9->do_print + 1);
                  } while (lVar24 != -0xff);
                  pcVar20 = fmsbuf_srch;
LAB_0012fd19:
                  pcVar20 = pcVar20 + -lVar24;
LAB_0012fd1c:
                  if ((iVar19 != 0) && (iVar19 == cVar9)) {
                    if (local_228 == (byte *)0x0) {
                      uVar11 = 0;
                    }
                    else {
                      local_228 = local_228 + -1;
                      uVar11 = (uint)*local_220;
                      local_220 = local_220 + 1;
                    }
                  }
                  *pcVar20 = '\0';
                }
                else {
                  fmsbuf_srch[0] = '\0';
                }
                iVar12 = stricmp(attrname,"height");
                if ((iVar12 == 0) && (stream->html_defer_br != 0)) {
                  uVar13 = atoi(fmsbuf_srch);
                  pbVar14 = (byte *)(ulong)uVar13;
                  if (uVar13 == 0) {
                    stream->html_defer_br = 1;
                  }
                  else if (1 < (int)uVar13) {
                    iVar12 = uVar13 + 1;
                    do {
                      outblank_stream(stream);
                      iVar12 = iVar12 + -1;
                      pbVar14 = extraout_RAX_06;
                    } while (1 < iVar12);
                  }
                }
                else {
                  uVar13 = stricmp(attrname,"alt");
                  pbVar14 = (byte *)(ulong)uVar13;
                  if ((uVar13 == 0) &&
                     ((stream->html_in_ignore == 0 &&
                      (pbVar14 = (byte *)(ulong)(byte)fmsbuf_srch[0],
                      fmsbuf_srch[0] != '\0' && stream->html_allow_alt != 0)))) {
                    pcVar20 = fmsbuf_srch;
                    do {
                      pcVar20 = pcVar20 + 1;
                      outchar_noxlat_stream(stream,G_cmap_output[(ulong)pbVar14 & 0xff]);
                      pbVar14 = (byte *)CONCAT71((int7)((ulong)extraout_RAX_05 >> 8),*pcVar20);
                    } while (*pcVar20 != '\0');
                  }
                }
                bVar28 = false;
                poVar18 = (out_stream_info *)(ulong)uVar11;
                goto LAB_0012fe7e;
              }
            }
            break;
          case 2:
            if (bVar10 == 0x27) {
LAB_0012f38e:
              stream->html_mode_flag = 1;
            }
            break;
          case 3:
            if (bVar10 == 0x22) goto LAB_0012f38e;
          }
LAB_0012f398:
          bVar28 = false;
LAB_0012f6af:
          pbVar14 = local_228;
          if (local_228 == (byte *)0x0) {
LAB_0012fe7b:
            poVar18 = (out_stream_info *)0x0;
          }
          else {
            local_228 = local_228 + -1;
            poVar18 = (out_stream_info *)(ulong)*local_220;
            pbVar14 = local_220;
            local_220 = local_220 + 1;
          }
        }
LAB_0012fe7e:
      } while ((char)poVar18 != '\0');
      iVar12 = (int)CONCAT71((int7)((ulong)pbVar14 >> 8),!bVar28);
    }
    if ((char)iVar12 == '\0') {
      outchar_noxlat_stream(stream,G_cmap_output[0x25]);
      pbVar14 = (byte *)fmsbuf;
      iVar12 = extraout_EAX;
      if (pbVar14 < pbVar22) {
        do {
          outchar_noxlat_stream(stream,G_cmap_output[*pbVar14]);
          pbVar14 = pbVar14 + 1;
          iVar12 = extraout_EAX_00;
        } while (pbVar14 != pbVar22);
      }
    }
    G_recurse = G_recurse + -1;
  }
  return iVar12;
}

Assistant:

static int outformatlen_stream(out_stream_info *stream,
                               char *s, size_t slen)
{
    char     c;
    int      done = 0;
    char     fmsbuf[40];       /* space for constructing translation string */
    uint     fmslen;
    char    *f = 0;
    char    *f1;
    int      infmt = 0;

    /* 
     *   This routine can recurse because of format strings ("%xxx%"
     *   sequences).  When we recurse, we want to ensure that the
     *   recursion is directed to the original stream only.  So, note the
     *   current stream statically in case we re-enter the formatter. 
     */
    if (!out_push_stream(stream))
        return 0;

    /* get the first character */
    c = nextout(&s, &slen);

    /* if we have anything to show, show it */
    while (c != '\0')
    {
        /* check if we're collecting translation string */
        if (infmt)
        {
            /*
             *   if the string is too long for our buffer, or we've come
             *   across a backslash (illegal in a format string), or we've
             *   come across an HTML-significant character ('&' or '<') in
             *   HTML mode, we must have a stray percent sign; dump the
             *   whole string so far and act as though we have no format
             *   string 
             */
            if (c == '\\'
                || f == &fmsbuf[sizeof(fmsbuf)]
                || (stream->html_mode && (c == '<' || c == '&')))
            {
                outchar_stream(stream, '%');
                for (f1 = fmsbuf ; f1 < f ; ++f1)
                    outchar_stream(stream, *f1);
                infmt = 0;

                /* process this character again */
                continue;
            }
            else if (c == '%' && f == fmsbuf)       /* double percent sign? */
            {
                outchar_stream(stream, '%');       /* send out a single '%' */
                infmt = 0;       /* no longer processing translation string */
            }
            else if (c == '%')   /* found end of string? translate it if so */
            {
                uchar *fms;
                int    initcap = FALSE;
                int    allcaps = FALSE;
                char   fmsbuf_srch[sizeof(fmsbuf)];

                /* null-terminate the string */
                *f = '\0';

                /* check for an init cap */
                if (outisup(fmsbuf[0]))
                {
                    /* 
                     *   note the initial capital, so that we follow the
                     *   original capitalization in the substituted string 
                     */
                    initcap = TRUE;

                    /* 
                     *   if the second letter is capitalized as well,
                     *   capitalize the entire substituted string 
                     */
                    if (fmsbuf[1] != '\0' && outisup(fmsbuf[1]))
                    {
                        /* use all caps */
                        allcaps = TRUE;
                    }
                }

                /* convert the entire string to lower case for searching */
                strcpy(fmsbuf_srch, fmsbuf);
                os_strlwr(fmsbuf_srch);
                
                /* find the string in the format string table */
                fmslen = strlen(fmsbuf_srch);
                for (fms = fmsbase ; fms < fmstop ; )
                {
                    uint propnum;
                    uint len;

                    /* get the information on this entry */
                    propnum = osrp2(fms);
                    len = osrp2(fms + 2) - 2;

                    /* check for a match */
                    if (len == fmslen &&
                        !memcmp(fms + 4, fmsbuf_srch, (size_t)len))
                    {
                        int old_all_caps;

                        /* note the current ALLCAPS mode */
                        old_all_caps = stream->allcapsflag;
                        
                        /* 
                         *   we have a match - set the appropriate
                         *   capitalization mode 
                         */
                        if (allcaps)
                            outallcaps_stream(stream, TRUE);
                        else if (initcap)
                            outcaps_stream(stream);

                        /* 
                         *   evaluate the associated property to generate
                         *   the substitution text 
                         */
                        runppr(runctx, cmdActor, (prpnum)propnum, 0);

                        /* turn off ALLCAPS mode */
                        outallcaps_stream(stream, old_all_caps);

                        /* no need to look any further */
                        break;
                    }

                    /* move on to next formatstring if not yet found */
                    fms += len + 4;
                }

                /* if we can't find it, dump the format string as-is */
                if (fms == fmstop)
                {
                    outchar_stream(stream, '%');
                    for (f1 = fmsbuf ; f1 < f ; ++f1)
                        outchar_stream(stream, *f1);
                    outchar_stream(stream, '%');
                }

                /* no longer reading format string */
                infmt = 0;
            }
            else
            {
                /* copy this character of the format string */
                *f++ = c;
            }

            /* move on to the next character and continue scanning */
            c = nextout(&s, &slen);
            continue;
        }
        
        /*
         *   If we're parsing HTML here, and we're inside a tag, skip
         *   characters until we reach the end of the tag.  
         */
        if (stream->html_mode_flag != HTML_MODE_NORMAL)
        {
            switch(stream->html_mode_flag)
            {
            case HTML_MODE_TAG:
                /* 
                 *   keep skipping up to the closing '>', but note when we
                 *   enter any quoted section 
                 */
                switch(c)
                {
                case '>':
                    /* we've reached the end of the tag */
                    stream->html_mode_flag = HTML_MODE_NORMAL;

                    /* if we have a deferred <BR>, process it now */
                    switch(stream->html_defer_br)
                    {
                    case HTML_DEFER_BR_NONE:
                        /* no deferred <BR> */
                        break;

                    case HTML_DEFER_BR_FLUSH:
                        outflushn_stream(stream, 1);
                        break;

                    case HTML_DEFER_BR_BLANK:
                        outblank_stream(stream);
                        break;
                    }

                    /* no more deferred <BR> pending */
                    stream->html_defer_br = HTML_DEFER_BR_NONE;

                    /* no more ALT attribute allowed */
                    stream->html_allow_alt = FALSE;
                    break;

                case '"':
                    /* enter a double-quoted string */
                    stream->html_mode_flag = HTML_MODE_DQUOTE;
                    break;

                case '\'':
                    /* enter a single-quoted string */
                    stream->html_mode_flag = HTML_MODE_SQUOTE;
                    break;

                default:
                    /* if it's alphabetic, note the attribute name */
                    if (outisal(c))
                    {
                        char attrname[128];
                        char attrval[256];
                        char *dst;

                        /* gather up the attribute name */
                        for (dst = attrname ;
                             dst + 1 < attrname + sizeof(attrname) ; )
                        {
                            /* store this character */
                            *dst++ = c;

                            /* get the next character */
                            c = nextout(&s, &slen);

                            /* if it's not alphanumeric, stop scanning */
                            if (!outisal(c) && !outisdg(c))
                                break;
                        }

                        /* null-terminate the result */
                        *dst++ = '\0';

                        /* gather the value if present */
                        if (c == '=')
                        {
                            char qu;
                            
                            /* skip the '=' */
                            c = nextout(&s, &slen);

                            /* if we have a quote, so note */
                            if (c == '"' || c == '\'')
                            {
                                /* remember the quote */
                                qu = c;

                                /* skip it */
                                c = nextout(&s, &slen);
                            }
                            else
                            {
                                /* no quote */
                                qu = 0;
                            }

                            /* read the value */
                            for (dst = attrval ;
                                 dst + 1 < attrval + sizeof(attrval) ; )
                            {
                                /* store this character */
                                *dst++ = c;

                                /* read the next one */
                                c = nextout(&s, &slen);
                                if (c == '\0')
                                {
                                    /* 
                                     *   we've reached the end of the
                                     *   string, and we're still inside
                                     *   this attribute - abandon the
                                     *   attribute but note that we're
                                     *   inside a quoted string if
                                     *   necessary 
                                     */
                                    if (qu == '"')
                                        stream->html_mode_flag =
                                            HTML_MODE_DQUOTE;
                                    else if (qu == '\'')
                                        stream->html_mode_flag =
                                            HTML_MODE_SQUOTE;
                                    else
                                        stream->html_mode_flag
                                            = HTML_MODE_TAG;

                                    /* stop scanning the string */
                                    break;
                                }

                                /* 
                                 *   if we're looking for a quote, check
                                 *   for the closing quote; otherwise,
                                 *   check for alphanumerics 
                                 */
                                if (qu != 0)
                                {
                                    /* if this is our quote, stop scanning */
                                    if (c == qu)
                                        break;
                                }
                                else
                                {
                                    /* if it's non-alphanumeric, we're done */
                                    if (!outisal(c) && !outisdg(c))
                                        break;
                                }
                            }

                            /* skip the closing quote, if necessary */
                            if (qu != 0 && c == qu)
                                c = nextout(&s, &slen);

                            /* null-terminate the value string */
                            *dst = '\0';
                        }
                        else
                        {
                            /* no value */
                            attrval[0] = '\0';
                        }

                        /* 
                         *   see if we recognize it, and it's meaningful
                         *   in the context of the current tag 
                         */
                        if (!stricmp(attrname, "height")
                            && stream->html_defer_br != HTML_DEFER_BR_NONE)
                        {
                            int ht;
                                
                            /*
                             *   If the height is zero, always treat this
                             *   as a non-blanking flush.  If it's one,
                             *   treat it as we originally planned to.  If
                             *   it's greater than one, add n blank lines.
                             */
                            ht = atoi(attrval);
                            if (ht == 0)
                            {
                                /* always use non-blanking flush */
                                stream->html_defer_br = HTML_DEFER_BR_FLUSH;
                            }
                            else if (ht == 1)
                            {
                                /* keep original setting */
                            }
                            else
                            {
                                for ( ; ht > 0 ; --ht)
                                    outblank_stream(stream);
                            }
                        }
                        else if (!stricmp(attrname, "alt")
                                 && !stream->html_in_ignore
                                 && stream->html_allow_alt)
                        {
                            /* write out the ALT string */
                            outstring_stream(stream, attrval);
                        }

                        /* 
                         *   since we already read the next character,
                         *   simply loop back immediately 
                         */
                        continue;
                    }
                    break;
                }
                break;

            case HTML_MODE_DQUOTE:
                /* if we've reached the closing quote, return to tag state */
                if (c == '"')
                    stream->html_mode_flag = HTML_MODE_TAG;
                break;

            case HTML_MODE_SQUOTE:
                /* if we've reached the closing quote, return to tag state */
                if (c == '\'')
                    stream->html_mode_flag = HTML_MODE_TAG;
                break;
            }

            /* 
             *   move on to the next character, and start over with the
             *   new character 
             */
            c = nextout(&s, &slen);
            continue;
        }

        /*
         *   If we're in a title, and this isn't the start of a new tag,
         *   skip the character - we suppress all regular text output
         *   inside a <TITLE> ... </TITLE> sequence. 
         */
        if (stream->html_in_ignore && c != '<')
        {
            /* check for entities */
            char cbuf[50];
            if (c == '&')
            {
                /* translate the entity */
                c = out_parse_entity(cbuf, sizeof(cbuf), &s, &slen);
            }
            else
            {
                /* it's an ordinary character - copy it out literally */
                cbuf[0] = c;
                cbuf[1] = '\0';

                /* get the next character */
                c = nextout(&s, &slen);
            }

            /* 
             *   if we're gathering a title, and there's room in the title
             *   buffer for more (always leaving room for a null
             *   terminator), add this to the title buffer 
             */
            if (stream->html_in_title)
            {
                char *cbp;
                for (cbp = cbuf ; *cbp != '\0' ; ++cbp)
                {
                    /* if there's room, add it */
                    if (stream->html_title_ptr + 1 <
                        stream->html_title_buf
                        + sizeof(stream->html_title_buf))
                        *stream->html_title_ptr++ = *cbp;
                }
            }

            /* don't display anything in an ignore section */
            continue;
        }
        
        if ( c == '%' )                              /* translation string? */
        {
            infmt = 1;
            f = fmsbuf;
        }
        else if ( c == '\\' )                       /* special escape code? */
        {
            c = nextout(&s, &slen);
            
            if (stream->capturing && c != '^' && c != 'v' && c != '\0')
            {
                outchar_stream(stream, '\\');
                outchar_stream(stream, c);

                /* keep the \- and also put out the next two chars */
                if (c == '-')
                {
                    outchar_stream(stream, nextout(&s, &slen));
                    outchar_stream(stream, nextout(&s, &slen));
                }
            }
            else
            {
                switch(c)
                {
                case 'H':                                /* HTML mode entry */
                    /* turn on HTML mode in the renderer */
                    switch(c = nextout(&s, &slen))
                    {
                    case '-':
                        /* if we have an HTML target, notify it */
                        if (stream->html_target)
                        {
                            /* flush its stream */
                            outflushn_stream(stream, 0);

                            /* tell the OS layer to switch to normal mode */
                            out_end_html(stream);
                        }

                        /* switch to normal mode */
                        stream->html_mode = FALSE;
                        break;

                    case '+':
                    default:
                        /* if we have an HTML target, notify it */
                        if (stream->html_target)
                        {
                            /* flush the underlying stream */
                            outflushn_stream(stream, 0);

                            /* tell the OS layer to switch to HTML mode */
                            out_start_html(stream);
                        }
                        
                        /* switch to HTML mode */
                        stream->html_mode = TRUE;

                        /* 
                         *   if the character wasn't a "+", it's not part
                         *   of the "\H" sequence, so display it normally 
                         */
                        if (c != '+' && c != 0)
                            outchar_stream(stream, c);
                        break;
                    }

                    /* this sequence doesn't result in any actual output */
                    break;

                case 'n':                                       /* newline? */
                    outflushn_stream(stream, 1);        /* yes, output line */
                    break;
                    
                case 't':                                           /* tab? */
                    outtab_stream(stream);
                    break;
                    
                case 'b':                                    /* blank line? */
                    outblank_stream(stream);
                    break;
                    
                case '\0':                               /* line ends here? */
                    done = 1;
                    break;

                case ' ':                                   /* quoted space */
                    if (stream->html_target && stream->html_mode)
                    {
                        /* 
                         *   we're generating for an HTML target and we're
                         *   in HTML mode - generate the HTML non-breaking
                         *   space 
                         */
                        outstring_stream(stream, "&nbsp;");
                    }
                    else
                    {
                        /* 
                         *   we're not in HTML mode - generate our
                         *   internal quoted space character 
                         */
                        outchar_stream(stream, QSPACE);
                    }
                    break;

                case '^':                      /* capitalize next character */
                    stream->capsflag = 1;
                    stream->nocapsflag = 0;
                    break;

                case 'v':
                    stream->nocapsflag = 1;
                    stream->capsflag = 0;
                    break;

                case '(':
                    /* generate HTML if in the appropriate mode */
                    if (stream->html_mode && stream->html_target)
                    {
                        /* send HTML to the renderer */
                        outstring_stream(stream, "<B>");
                    }
                    else
                    {
                        /* turn on the 'hilite' attribute */
                        stream->cur_attr |= OS_ATTR_HILITE;
                    }
                    break;

                case ')':
                    /* generate HTML if in the appropriate mode */
                    if (stream->html_mode && stream->html_target)
                    {
                        /* send HTML to the renderer */
                        outstring_stream(stream, "</B>");
                    }
                    else
                    {
                        /* turn off the 'hilite' attribute */
                        stream->cur_attr &= ~OS_ATTR_HILITE;
                    }
                    break;

                case '-':
                    outchar_stream(stream, nextout(&s, &slen));
                    outchar_stream(stream, nextout(&s, &slen));
                    break;
                    
                default:                 /* just pass invalid escapes as-is */
                    outchar_stream(stream, c);
                    break;
                }
            }
        }
        else if (!stream->html_target
                 && stream->html_mode
                 && (c == '<' || c == '&'))
        {
            /*
             *   We're in HTML mode, but the underlying target does not
             *   accept HTML sequences.  It appears we're at the start of
             *   an "&" entity or a tag sequence, so parse it, remove it,
             *   and replace it (if possible) with a text-only equivalent. 
             */
            if (c == '<')
            {
                /* read the tag */
                char tagbuf[50];
                int is_end_tag;
                c = read_tag(tagbuf, sizeof(tagbuf), &is_end_tag,
                             &s, &slen, 0);

                /*
                 *   Check to see if we recognize the tag.  We only
                 *   recognize a few simple tags that map easily to
                 *   character mode. 
                 */
                if (!stricmp(tagbuf, "br"))
                {
                    /* 
                     *   line break - if there's anything buffered up,
                     *   just flush the current line, otherwise write out
                     *   a blank line 
                     */
                    if (stream->html_in_ignore)
                        /* suppress breaks in ignore mode */;
                    else if (stream->linepos != 0)
                        stream->html_defer_br = HTML_DEFER_BR_FLUSH;
                    else
                        stream->html_defer_br = HTML_DEFER_BR_BLANK;
                }
                else if (!stricmp(tagbuf, "b")
                         || !stricmp(tagbuf, "i")
                         || !stricmp(tagbuf, "em")
                         || !stricmp(tagbuf, "strong"))
                {
                    int attr;
                    
                    /* choose the attribute flag */
                    switch (tagbuf[0])
                    {
                    case 'b':
                    case 'B':
                        attr = OS_ATTR_BOLD;
                        break;

                    case 'i':
                    case 'I':
                        attr = OS_ATTR_ITALIC;
                        break;

                    case 'e':
                    case 'E':
                        attr = OS_ATTR_EM;
                        break;

                    case 's':
                    case 'S':
                        attr = OS_ATTR_STRONG;
                        break;
                    }
                    
                    /* bold on/off - send out appropriate os-layer code */
                    if (stream->html_in_ignore)
                    {
                        /* suppress any change in 'ignore' mode */
                    }
                    else if (!is_end_tag)
                    {
                        /* turn on the selected attribute */
                        stream->cur_attr |= attr;
                    }
                    else
                    {
                        /* turn off the selected attribute */
                        stream->cur_attr &= ~attr;
                    }
                }
                else if (!stricmp(tagbuf, "p"))
                {
                    /* paragraph - send out a blank line */
                    if (!stream->html_in_ignore)
                        outblank_stream(stream);
                }
                else if (!stricmp(tagbuf, "tab"))
                {
                    /* tab - send out a \t */
                    if (!stream->html_in_ignore)
                        outtab_stream(stream);
                }
                else if (!stricmp(tagbuf, "img") || !stricmp(tagbuf, "sound"))
                {
                    /* IMG and SOUND - allow ALT attributes */
                    stream->html_allow_alt = TRUE;
                }
                else if (!stricmp(tagbuf, "hr"))
                {
                    int rem;
                    
                    if (!stream->html_in_ignore)
                    {
                        /* start a new line */
                        outflushn_stream(stream, 1);

                        /* write out underscores to the display width */
                        for (rem = G_os_linewidth - 1 ; rem > 0 ; )
                        {
                            char dashbuf[100];
                            int cur;
                            
                            /* do as much as we can on this pass */
                            cur = rem;
                            if ((size_t)cur > sizeof(dashbuf) - 1)
                                cur = sizeof(dashbuf) - 1;
                            
                            /* do a buffer-full of dashes */
                            memset(dashbuf, '_', cur);
                            dashbuf[cur] = '\0';
                            outstring_stream(stream, dashbuf);
                            
                            /* deduct this from the total */
                            rem -= cur;
                        }

                        /* put a blank line after the underscores */
                        outblank_stream(stream);
                    }
                }
                else if (!stricmp(tagbuf, "q"))
                {
                    unsigned int htmlchar;

                    if (!stream->html_in_ignore)
                    {
                        /* if it's an open quote, increment the level */
                        if (!is_end_tag)
                            ++(stream->html_quote_level);
                        
                        /* add the open quote */
                        htmlchar =
                            (!is_end_tag
                             ? ((stream->html_quote_level & 1) == 1
                                ? 8220 : 8216)
                             : ((stream->html_quote_level & 1) == 1
                                ? 8221 : 8217));
                        
                        /* 
                         *   write out the HTML character, translated to
                         *   the local character set 
                         */
                        outchar_html_stream(stream, htmlchar);
                        
                        /* if it's a close quote, decrement the level */
                        if (is_end_tag)
                            --(stream->html_quote_level);
                    }
                }
                else if (!stricmp(tagbuf, "title"))
                {
                    /* 
                     *   Turn ignore mode on or off as appropriate, and
                     *   turn on or off title mode as well.
                     */
                    if (is_end_tag)
                    {
                        /* 
                         *   note that we're leaving an ignore section and
                         *   a title section 
                         */
                        --(stream->html_in_ignore);
                        --(stream->html_in_title);

                        /* 
                         *   if we're no longer in a title, call the OS
                         *   layer to tell it the title string, in case it
                         *   wants to change the window title or otherwise
                         *   make use of the title 
                         */
                        if (stream->html_in_title == 0)
                        {
                            /* null-terminate the title string */
                            *stream->html_title_ptr = '\0';
                            
                            /* tell the OS about the title */
                            os_set_title(stream->html_title_buf);
                        }
                    }
                    else
                    {
                        /* 
                         *   if we aren't already in a title, set up to
                         *   capture the title into the title buffer 
                         */
                        if (!stream->html_in_title)
                            stream->html_title_ptr = stream->html_title_buf;

                        /* 
                         *   note that we're in a title and in an ignore
                         *   section, since nothing within gets displayed 
                         */
                        ++(stream->html_in_ignore);
                        ++(stream->html_in_title);
                    }
                }
                else if (!stricmp(tagbuf, "aboutbox"))
                {
                    /* turn ignore mode on or off as appropriate */
                    if (is_end_tag)
                        --(stream->html_in_ignore);
                    else
                        ++(stream->html_in_ignore);
                }
                else if (!stricmp(tagbuf, "pre"))
                {
                    /* count the nesting level if starting PRE mode */
                    if (!is_end_tag)
                        stream->html_pre_level += 1;

                    /* surround the PRE block with line breaks */
                    outblank_stream(stream);

                    /* count the nesting level if ending PRE mode */
                    if (is_end_tag && stream->html_pre_level != 0)
                        stream->html_pre_level -= 1;
                }

                /* suppress everything up to the next '>' */
                stream->html_mode_flag = HTML_MODE_TAG;

                /* 
                 *   continue with the current character; since we're in
                 *   html tag mode, we'll skip everything until we get to
                 *   the closing '>' 
                 */
                continue;
            }
            else if (c == '&')
            {
                /* parse it */
                char  xlat_buf[50];
                c = out_parse_entity(xlat_buf, sizeof(xlat_buf), &s, &slen);

                /* write it out (we've already translated it) */
                outstring_noxlat_stream(stream, xlat_buf);
                
                /* proceed with the next character */
                continue;
            }
        }
        else if (stream->html_target && stream->html_mode && c == '<')
        {
            /*
             *   We're in HTML mode, and we have an underlying HTML target.
             *   We don't need to do much HTML interpretation at this level.
             *   However, we do need to keep track of when we're in a PRE
             *   block, so that we can pass whitespaces and newlines through
             *   to the underlying HTML engine without filtering when we're
             *   in preformatted text. 
             */
            char tagbuf[50];
            int is_end_tag;
            c = read_tag(tagbuf, sizeof(tagbuf), &is_end_tag,
                         &s, &slen, stream);

            /* check for special tags */
            if (!stricmp(tagbuf, "pre"))
            {
                /* count the nesting level */
                if (!is_end_tag)
                    stream->html_pre_level += 1;
                else if (is_end_tag && stream->html_pre_level != 0)
                    stream->html_pre_level -= 1;
            }

            /* copy the last character after the tag to the stream */
            if (c != 0)
                outchar_stream(stream, c);
        }
        else
        {
            /* normal character */
            outchar_stream(stream, c);
        }

        /* move on to the next character, unless we're finished */
        if (done)
            c = '\0';
        else
            c = nextout(&s, &slen);
    }

    /* if we ended up inside what looked like a format string, dump string */
    if (infmt)
    {
        outchar_stream(stream, '%');
        for (f1 = fmsbuf ; f1 < f ; ++f1)
            outchar_stream(stream, *f1);
    }

    /* exit a recursion level */
    out_pop_stream();

    /* success */
    return 0;
}